

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

uint llvm::APInt::tcLSB(WordType *parts,uint n)

{
  uint uVar1;
  uint local_20;
  uint lsb;
  uint i;
  uint n_local;
  WordType *parts_local;
  
  local_20 = 0;
  while( true ) {
    if (n <= local_20) {
      return 0xffffffff;
    }
    if (parts[local_20] != 0) break;
    local_20 = local_20 + 1;
  }
  uVar1 = partLSB(parts[local_20]);
  return uVar1 + local_20 * 0x40;
}

Assistant:

unsigned APInt::tcLSB(const WordType *parts, unsigned n) {
  for (unsigned i = 0; i < n; i++) {
    if (parts[i] != 0) {
      unsigned lsb = partLSB(parts[i]);

      return lsb + i * APINT_BITS_PER_WORD;
    }
  }

  return -1U;
}